

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

bool __thiscall libtorrent::bdecode_node::has_soft_error(bdecode_node *this,span<char> error)

{
  uint uVar1;
  bdecode_token *pbVar2;
  bool bVar3;
  type_t tVar4;
  int iVar5;
  reference pvVar6;
  int *piVar7;
  char *pcVar8;
  size_t sVar9;
  int cmp;
  int min_len;
  int k2_len;
  int k2_start;
  int k1_len;
  int k1_start;
  int v2;
  int k2;
  int v1;
  int k1;
  value_type parent;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> stack;
  int token;
  bdecode_token *tokens;
  bdecode_node *this_local;
  span<char> error_local;
  
  error_local.m_ptr = (char *)error.m_len;
  this_local = (bdecode_node *)error.m_ptr;
  tVar4 = type(this);
  if (tVar4 == none_t) {
    error_local.m_len._7_1_ = 0;
  }
  else {
    pbVar2 = this->m_root_tokens;
    stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = this->m_token_idx;
    ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
    ::std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_50,100);
    do {
      switch(*(uint *)(pbVar2 + stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_) >> 0x1d) {
      case 1:
      case 2:
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_50,
                   (value_type_conflict2 *)
                   ((long)&stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
        break;
      case 3:
      case 5:
        if ((this->m_buffer
             [SUB84(pbVar2[stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_],0) & 0x1fffffff] == '0')
           && (this->m_buffer
               [(int)((SUB84(pbVar2[stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_],0) & 0x1fffffff
                      ) + 1)] != ':')) {
          pcVar8 = span<char>::data((span<char> *)&this_local);
          sVar9 = span<char>::size((span<char> *)&this_local);
          snprintf(pcVar8,sVar9,"leading zero in string length");
          error_local.m_len._7_1_ = 1;
          goto LAB_002218f4;
        }
        break;
      case 4:
        if ((this->m_buffer
             [(int)((SUB84(pbVar2[stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_],0) & 0x1fffffff)
                   + 1)] == '0') &&
           (this->m_buffer
            [(int)((SUB84(pbVar2[stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_],0) & 0x1fffffff) +
                  2)] != 'e')) {
          pcVar8 = span<char>::data((span<char> *)&this_local);
          sVar9 = span<char>::size((span<char> *)&this_local);
          snprintf(pcVar8,sVar9,"leading zero in integer");
          error_local.m_len._7_1_ = 1;
          goto LAB_002218f4;
        }
        break;
      case 6:
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::back
                           ((vector<int,_std::allocator<int>_> *)local_50);
        v1 = *pvVar6;
        ::std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)local_50);
        if ((((uint)((ulong)pbVar2[v1] >> 0x1d) & 7) == 1) &&
           (stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ != v1 + 1)) {
          k2 = v1 + 1;
          while( true ) {
            v2 = k2 + (SUB84(pbVar2[k2],4) & 0x1fffffff);
            k1_start = v2 + (SUB84(pbVar2[v2],4) & 0x1fffffff);
            if (k1_start ==
                stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._4_4_) break;
            k1_len = k1_start + (*(uint *)&pbVar2[k1_start].field_0x4 & 0x1fffffff);
            uVar1 = *(uint *)(pbVar2 + k2);
            iVar5 = libtorrent::aux::bdecode_token::start_offset(pbVar2 + k2);
            k2_start = (uVar1 & 0x1fffffff) + iVar5;
            k2_len = (*(uint *)(pbVar2 + v2) & 0x1fffffff) - k2_start;
            uVar1 = *(uint *)(pbVar2 + k1_start);
            iVar5 = libtorrent::aux::bdecode_token::start_offset(pbVar2 + k1_start);
            min_len = (uVar1 & 0x1fffffff) + iVar5;
            cmp = (*(uint *)(pbVar2 + k1_len) & 0x1fffffff) - min_len;
            piVar7 = ::std::min<int>(&k2_len,&cmp);
            iVar5 = memcmp(this->m_buffer + k2_start,this->m_buffer + min_len,(long)*piVar7);
            if ((0 < iVar5) || ((iVar5 == 0 && (cmp < k2_len)))) {
              pcVar8 = span<char>::data((span<char> *)&this_local);
              sVar9 = span<char>::size((span<char> *)&this_local);
              snprintf(pcVar8,sVar9,"unsorted dictionary key");
              error_local.m_len._7_1_ = 1;
              goto LAB_002218f4;
            }
            if ((iVar5 == 0) && (k2_len == cmp)) {
              pcVar8 = span<char>::data((span<char> *)&this_local);
              sVar9 = span<char>::size((span<char> *)&this_local);
              snprintf(pcVar8,sVar9,"duplicate dictionary key");
              error_local.m_len._7_1_ = 1;
              goto LAB_002218f4;
            }
            k2 = k1_start;
          }
        }
      }
      stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1;
      bVar3 = ::std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)local_50);
    } while (((bVar3 ^ 0xffU) & 1) != 0);
    error_local.m_len._7_1_ = 0;
LAB_002218f4:
    k1 = 1;
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50)
    ;
  }
  return (bool)(error_local.m_len._7_1_ & 1);
}

Assistant:

bool bdecode_node::has_soft_error(span<char> error) const
	{
		if (type() == none_t) return false;

		bdecode_token const* tokens = m_root_tokens;
		int token = m_token_idx;

		// we don't know what the original depth_limit was
		// so this has to go on the heap
		std::vector<int> stack;
		// make the initial allocation the default depth_limit
		stack.reserve(100);

		do
		{
			switch (tokens[token].type)
			{
			case bdecode_token::integer:
				if (m_buffer[tokens[token].offset + 1] == '0'
					&& m_buffer[tokens[token].offset + 2] != 'e')
				{
					std::snprintf(error.data(), std::size_t(error.size()), "leading zero in integer");
					return true;
				}
				break;
			case bdecode_token::string:
			case bdecode_token::long_string:
				if (m_buffer[tokens[token].offset] == '0'
					&& m_buffer[tokens[token].offset + 1] != ':')
				{
					std::snprintf(error.data(), std::size_t(error.size()), "leading zero in string length");
					return true;
				}
				break;
			case bdecode_token::dict:
			case bdecode_token::list:
				stack.push_back(token);
				break;
			case bdecode_token::end:
				auto const parent = stack.back();
				stack.pop_back();
				if (tokens[parent].type == bdecode_token::dict
					&& token != parent + 1)
				{
					// this is the end of a non-empty dict
					// check the sort order of the keys
					int k1 = parent + 1;
					for (;;)
					{
						// skip to the first key's value
						int const v1 = k1 + tokens[k1].next_item;
						// then to the next key
						int const k2 = v1 + tokens[v1].next_item;

						// check if k1 was the last key in the dict
						if (k2 == token)
							break;

						int const v2 = k2 + tokens[k2].next_item;

						int const k1_start = tokens[k1].offset + tokens[k1].start_offset();
						int const k1_len = tokens[v1].offset - k1_start;
						int const k2_start = tokens[k2].offset + tokens[k2].start_offset();
						int const k2_len = tokens[v2].offset - k2_start;

						int const min_len = std::min(k1_len, k2_len);

						int cmp = std::memcmp(m_buffer + k1_start, m_buffer + k2_start, std::size_t(min_len));
						if (cmp > 0 || (cmp == 0 && k1_len > k2_len))
						{
							std::snprintf(error.data(), std::size_t(error.size()), "unsorted dictionary key");
							return true;
						}
						else if (cmp == 0 && k1_len == k2_len)
						{
							std::snprintf(error.data(), std::size_t(error.size()), "duplicate dictionary key");
							return true;
						}

						k1 = k2;
					}
				}
				break;
			}

			++token;
		} while (!stack.empty());
		return false;
	}